

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

menu_row_style_t menu_row_style_for_validity(menu_row_validity_t row_valid)

{
  menu_row_style_t local_10;
  menu_row_style_t style;
  menu_row_validity_t row_valid_local;
  
  if ((row_valid == MN_ROW_INVALID) || ((row_valid != MN_ROW_VALID && (row_valid == MN_ROW_HIDDEN)))
     ) {
    local_10 = MN_ROW_STYLE_DISABLED;
  }
  else {
    local_10 = MN_ROW_STYLE_ENABLED;
  }
  return local_10;
}

Assistant:

static menu_row_style_t menu_row_style_for_validity(menu_row_validity_t row_valid)
{
	menu_row_style_t style;

	switch (row_valid) {
		case MN_ROW_INVALID:
		case MN_ROW_HIDDEN:
			style = MN_ROW_STYLE_DISABLED;
			break;
		case MN_ROW_VALID:
		default:
			style = MN_ROW_STYLE_ENABLED;
			break;
	}

	return style;
}